

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderDiscardCase::init(ShaderDiscardCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  undefined8 uVar2;
  uint uVar3;
  Texture2D *tex2D;
  TextureBinding *extraout_RAX;
  long lVar4;
  char **ppcVar5;
  iterator iVar6;
  byte bVar7;
  TextureBinding local_a8;
  Sampler local_5c;
  iterator __position;
  
  bVar7 = 0;
  uVar3 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  __position._M_current = (TextureBinding *)(ulong)uVar3;
  if ((this->m_flags & 1) != 0) {
    local_a8._0_8_ = "data/brick.png";
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,1,(char **)&local_a8);
    this->m_brickTexture = tex2D;
    local_5c.wrapS = CLAMP_TO_EDGE;
    local_5c.wrapT = CLAMP_TO_EDGE;
    local_5c.wrapR = CLAMP_TO_EDGE;
    local_5c.minFilter = LINEAR;
    local_5c.magFilter = LINEAR;
    local_5c.lodThreshold = 0.0;
    local_5c.normalizedCoords = true;
    local_5c.depthStencilMode = MODE_DEPTH;
    local_5c.compare = COMPAREMODE_NONE;
    local_5c.compareChannel = 0;
    local_5c.borderColor.v.uData[0]._0_1_ = 0;
    local_5c.borderColor.v._1_7_ = 0;
    local_5c.borderColor.v.uData[2]._0_1_ = 0;
    local_5c._45_8_ = 0;
    deqp::gls::TextureBinding::TextureBinding(&local_a8,tex2D,&local_5c);
    __position._M_current =
         (this->super_ShaderRenderCase).m_textures.
         super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_ShaderRenderCase).m_textures.
        super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
      _M_realloc_insert<deqp::gls::TextureBinding>
                (&(this->super_ShaderRenderCase).m_textures,__position,&local_a8);
      __position._M_current = extraout_RAX;
    }
    else {
      ppcVar5 = (char **)&local_a8;
      iVar6._M_current = __position._M_current;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        uVar2 = *ppcVar5;
        (iVar6._M_current)->m_type = (int)uVar2;
        ((iVar6._M_current)->m_sampler).wrapS = (int)((ulong)uVar2 >> 0x20);
        ppcVar5 = ppcVar5 + (ulong)bVar7 * -2 + 1;
        iVar6._M_current = iVar6._M_current + (ulong)bVar7 * -0x10 + 8;
      }
      ppTVar1 = &(this->super_ShaderRenderCase).m_textures.
                 super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
  }
  return (int)__position._M_current;
}

Assistant:

void ShaderDiscardCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
	}
}